

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O0

bool __thiscall
r_exec::PTPX::build_mdl
          (PTPX *this,_Fact *cause,_Fact *consequent,GuardBuilder *guard_builder,uint64_t period)

{
  BindingMap *this_00;
  HLPBindingMap *bm_00;
  Code *pCVar1;
  ModelBase *this_01;
  Code *pCVar2;
  Code *_m0;
  P<r_code::Code> m0;
  uint16_t write_index;
  P<r_exec::BindingMap> local_40;
  P<r_exec::BindingMap> bm;
  uint64_t period_local;
  GuardBuilder *guard_builder_local;
  _Fact *consequent_local;
  _Fact *cause_local;
  PTPX *this_local;
  
  bm.object = (_Object *)period;
  this_00 = (BindingMap *)operator_new(0x38);
  BindingMap::BindingMap(this_00);
  core::P<r_exec::BindingMap>::P(&local_40,this_00);
  bm_00 = core::P::operator_cast_to_HLPBindingMap_((P *)&local_40);
  pCVar1 = _TPX::build_mdl_head
                     (&this->super__TPX,bm_00,0,cause,consequent,(uint16_t *)((long)&m0.object + 2))
  ;
  core::P<r_code::Code>::P((P<r_code::Code> *)&_m0,pCVar1);
  pCVar1 = core::P::operator_cast_to_Code_((P *)&_m0);
  (*(guard_builder->super__Object)._vptr__Object[2])
            (guard_builder,pCVar1,0,cause,(undefined1 *)((long)&m0.object + 2));
  pCVar1 = core::P::operator_cast_to_Code_((P *)&_m0);
  _TPX::build_mdl_tail(&this->super__TPX,pCVar1,m0.object._2_2_);
  this_01 = ModelBase::Get();
  pCVar1 = core::P::operator_cast_to_Code_((P *)&_m0);
  pCVar1 = ModelBase::check_existence(this_01,pCVar1);
  if (pCVar1 == (Code *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pCVar2 = core::P::operator_cast_to_Code_((P *)&_m0);
    if (pCVar1 == pCVar2) {
      std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::push_back
                (&(this->super__TPX).mdls,(value_type *)&_m0);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  core::P<r_code::Code>::~P((P<r_code::Code> *)&_m0);
  core::P<r_exec::BindingMap>::~P(&local_40);
  return this_local._7_1_;
}

Assistant:

bool PTPX::build_mdl(_Fact *cause, _Fact *consequent, GuardBuilder *guard_builder, uint64_t period)
{
    P<BindingMap> bm = new BindingMap();
    uint16_t write_index;
    P<Code> m0 = build_mdl_head(bm, 0, cause, consequent, write_index);
    guard_builder->build(m0, nullptr, cause, write_index);
    build_mdl_tail(m0, write_index);
    Code *_m0 = ModelBase::Get()->check_existence(m0);

    if (_m0 == nullptr) {
        return false;
    } else if (_m0 == m0) {
        mdls.push_back(m0);
        return true;
    } else {
        return false;
    }
}